

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

char * flow::cstr(UnaryOperator op)

{
  code *pcVar1;
  char *pcStack_10;
  UnaryOperator op_local;
  
  switch(op) {
  case INeg:
    pcStack_10 = "ineg";
    break;
  case INot:
    pcStack_10 = "inot";
    break;
  case BNot:
    pcStack_10 = "bnot";
    break;
  case SLen:
    pcStack_10 = "slen";
    break;
  case SIsEmpty:
    pcStack_10 = "sisempty";
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return pcStack_10;
}

Assistant:

const char* cstr(UnaryOperator op)  // {{{
{
  switch (op) {
  case UnaryOperator::INeg: return "ineg";
  case UnaryOperator::INot: return "inot";
  case UnaryOperator::BNot: return "bnot";
  case UnaryOperator::SLen: return "slen";
  case UnaryOperator::SIsEmpty: return "sisempty";
  }
}